

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O3

CMutableTransaction *
BuildSpendingTransaction
          (CMutableTransaction *__return_storage_ptr__,CScript *scriptSig,
          CScriptWitness *scriptWitness,CTransaction *txCredit)

{
  long lVar1;
  pointer pCVar2;
  pointer pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(__return_storage_ptr__);
  __return_storage_ptr__->version = 1;
  __return_storage_ptr__->nLockTime = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&__return_storage_ptr__->vin,1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&__return_storage_ptr__->vout,1);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&(((__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                 _M_impl.super__Vector_impl_data._M_start)->scriptWitness).stack,
              &scriptWitness->stack);
  pCVar2 = (__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = *(undefined8 *)(txCredit->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar5 = *(undefined8 *)((txCredit->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar6 = *(undefined8 *)((txCredit->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((long)&(pCVar2->prevout).hash + 0x10) =
       *(undefined8 *)((txCredit->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((long)&(pCVar2->prevout).hash + 0x18) = uVar6;
  *(undefined8 *)&(pCVar2->prevout).hash = uVar4;
  *(undefined8 *)((long)&(pCVar2->prevout).hash + 8) = uVar5;
  pCVar2 = (__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pCVar2->prevout).n = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(pCVar2->scriptSig).super_CScriptBase,&scriptSig->super_CScriptBase);
  ((__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
   super__Vector_impl_data._M_start)->nSequence = 0xffffffff;
  pCVar3 = (__return_storage_ptr__->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0x1c < (pCVar3->scriptPubKey).super_CScriptBase._size) {
    free((pCVar3->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect);
  }
  *(undefined8 *)((long)&(pCVar3->scriptPubKey).super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)((long)&(pCVar3->scriptPubKey).super_CScriptBase._union + 0x18) = 0;
  (pCVar3->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(pCVar3->scriptPubKey).super_CScriptBase._union + 8) = 0;
  ((__return_storage_ptr__->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue =
       ((txCredit->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start)->nValue;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CMutableTransaction BuildSpendingTransaction(const CScript& scriptSig, const CScriptWitness& scriptWitness, const CTransaction& txCredit)
{
    CMutableTransaction txSpend;
    txSpend.version = 1;
    txSpend.nLockTime = 0;
    txSpend.vin.resize(1);
    txSpend.vout.resize(1);
    txSpend.vin[0].scriptWitness = scriptWitness;
    txSpend.vin[0].prevout.hash = txCredit.GetHash();
    txSpend.vin[0].prevout.n = 0;
    txSpend.vin[0].scriptSig = scriptSig;
    txSpend.vin[0].nSequence = CTxIn::SEQUENCE_FINAL;
    txSpend.vout[0].scriptPubKey = CScript();
    txSpend.vout[0].nValue = txCredit.vout[0].nValue;

    return txSpend;
}